

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

void __thiscall
boost::python::
class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
::class_(class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
         *this,char *name,char *doc)

{
  init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>
  local_28;
  
  local_28.
  super_init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  .m_doc = "11timestamp_t";
  objects::class_base::class_base(&this->super_class_base,name,1,(type_info *)&local_28,doc);
  local_28.
  super_init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  .m_doc = (char *)0x0;
  local_28.
  super_init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  .m_keywords.first = (keyword *)0x0;
  local_28.
  super_init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  .m_keywords.second = (keyword *)0x0;
  class_<timestamp_t,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<timestamp_t,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)this,&local_28);
  return;
}

Assistant:

inline class_<W,X1,X2,X3>::class_(char const* name, char const* doc)
    : base(name, id_vector::size, id_vector().ids, doc)
{
    this->initialize(init<>());
//  select_holder::assert_default_constructible();
}